

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>,true>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,int param_3,uint param_4)

{
  undefined4 *puVar1;
  double *pdVar2;
  undefined8 *puVar3;
  HighsInt HVar4;
  pointer ppVar5;
  void *pvVar6;
  pointer ppVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  HighsInt HVar14;
  bool bVar15;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar16;
  long lVar17;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar18;
  FractionalInteger *pFVar19;
  long lVar21;
  long lVar22;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var23;
  ulong uVar24;
  pointer ppVar25;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar26;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar27;
  ulong uVar28;
  pointer ppVar29;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var30;
  FractionalInteger *pFVar31;
  long lVar32;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar33;
  _Iter_comp_iter<std::less<FractionalInteger>_> __cmp;
  double local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined8 uStack_d4;
  pointer local_c8;
  pointer ppStack_c0;
  pointer local_b8;
  pointer ppStack_b0;
  int local_9c;
  pointer local_98;
  pointer ppStack_90;
  FractionalInteger *local_88;
  FractionalInteger *local_80;
  FractionalInteger *local_78;
  long local_70;
  pointer local_68;
  pointer ppStack_60;
  FractionalInteger *local_58;
  FractionalInteger *local_50;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_48;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_40;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_38;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var20;
  
  local_78 = end._M_current + -1;
  local_50 = end._M_current + -2;
  local_58 = end._M_current + -3;
  local_38 = &end._M_current[-1].row_ep;
  local_40 = &end._M_current[-2].row_ep;
  local_48 = &end._M_current[-3].row_ep;
  local_9c = param_3;
  local_88 = end._M_current;
  do {
    lVar17 = (long)end._M_current - (long)begin._M_current;
    if (lVar17 < 0x540) {
      pFVar31 = begin._M_current + 1;
      bVar15 = true;
      if ((param_4 & 1) == 0) {
        if (pFVar31 != end._M_current && begin._M_current != end._M_current) {
          pvVar27 = &(begin._M_current)->row_ep;
          _Var23._M_current = begin._M_current;
          do {
            pFVar19 = pFVar31;
            ppVar25 = (pointer)_Var23._M_current[1].score;
            if ((_Var23._M_current)->score <= (double)ppVar25 &&
                (double)ppVar25 != (_Var23._M_current)->score) {
              local_e8 = pFVar19->fractionality;
              uStack_e0 = SUB84(pFVar19->row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)pFVar19->row_ep_norm2 >> 0x20);
              HVar4 = _Var23._M_current[1].basisIndex;
              ppVar5 = _Var23._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar7 = _Var23._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ppVar29 = _Var23._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              _Var23._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var23._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var23._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pvVar16 = pvVar27;
              local_b8 = ppVar25;
              do {
                pvVar18 = pvVar16;
                uVar8 = *(undefined4 *)((long)(pvVar18 + -2) + 0x10);
                uVar9 = *(undefined4 *)((long)(pvVar18 + -2) + 0x14);
                uVar10 = *(undefined4 *)(pvVar18 + -1);
                uVar11 = *(undefined4 *)((long)(pvVar18 + -1) + 4);
                uVar12 = *(undefined4 *)((long)(pvVar18 + -1) + 8);
                uVar13 = *(undefined4 *)((long)(pvVar18 + -1) + 0xc);
                HVar14 = *(HighsInt *)((long)(pvVar18 + -1) + 0x10);
                *(undefined4 *)((long)(pvVar18 + 1) + 0xc) =
                     *(undefined4 *)((long)(pvVar18 + -1) + 4);
                *(undefined4 *)((long)(pvVar18 + 1) + 0x10) = uVar12;
                *(undefined4 *)((long)(pvVar18 + 1) + 0x14) = uVar13;
                *(HighsInt *)(pvVar18 + 2) = HVar14;
                *(undefined4 *)(pvVar18 + 1) = uVar8;
                *(undefined4 *)((long)(pvVar18 + 1) + 4) = uVar9;
                *(undefined4 *)((long)(pvVar18 + 1) + 8) = uVar10;
                *(undefined4 *)((long)(pvVar18 + 1) + 0xc) = uVar11;
                std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)((long)(pvVar18 + 2) + 8),pvVar18);
                pvVar16 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)((long)(pvVar18 + -3) + 0x10);
              } while (*(double *)(pvVar18 + -3) <= (double)local_b8 &&
                       (double)local_b8 != *(double *)(pvVar18 + -3));
              *(double *)((long)(pvVar18 + -2) + 0x10) = local_e8;
              *(ulong *)(pvVar18 + -1) = CONCAT44(uStack_dc,uStack_e0);
              *(pointer *)((long)(pvVar18 + -1) + 8) = local_b8;
              *(HighsInt *)((long)(pvVar18 + -1) + 0x10) = HVar4;
              ppVar25 = (pvVar18->
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              (pvVar18->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = ppVar5;
              (pvVar18->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = ppVar7;
              (pvVar18->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              end._M_current = local_88;
              if (ppVar25 != (pointer)0x0) {
                operator_delete(ppVar25);
                end._M_current = local_88;
              }
            }
            pvVar27 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      ((long)(pvVar27 + 2) + 8);
            pFVar31 = pFVar19 + 1;
            _Var23._M_current = pFVar19;
          } while (pFVar19 + 1 != end._M_current);
          goto LAB_002f2529;
        }
      }
      else if (pFVar31 != end._M_current && begin._M_current != end._M_current) {
        pvVar27 = &(begin._M_current)->row_ep;
        lVar17 = 0;
        _Var23._M_current = begin._M_current;
        do {
          pFVar19 = pFVar31;
          local_b8 = (pointer)_Var23._M_current[1].score;
          if ((_Var23._M_current)->score <= (double)local_b8 &&
              (double)local_b8 != (_Var23._M_current)->score) {
            local_e8 = pFVar19->fractionality;
            uStack_e0 = SUB84(pFVar19->row_ep_norm2,0);
            uStack_dc = (undefined4)((ulong)pFVar19->row_ep_norm2 >> 0x20);
            HVar4 = _Var23._M_current[1].basisIndex;
            ppVar25 = _Var23._M_current[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar29 = _Var23._M_current[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_c8 = _Var23._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            _Var23._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var23._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var23._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar16 = pvVar27;
            lVar32 = lVar17;
            do {
              pvVar18 = pvVar16;
              uVar8 = *(undefined4 *)((long)(pvVar18 + -2) + 0x10);
              uVar9 = *(undefined4 *)((long)(pvVar18 + -2) + 0x14);
              uVar10 = *(undefined4 *)(pvVar18 + -1);
              uVar11 = *(undefined4 *)((long)(pvVar18 + -1) + 4);
              uVar12 = *(undefined4 *)((long)(pvVar18 + -1) + 8);
              uVar13 = *(undefined4 *)((long)(pvVar18 + -1) + 0xc);
              HVar14 = *(HighsInt *)((long)(pvVar18 + -1) + 0x10);
              *(undefined4 *)((long)(pvVar18 + 1) + 0xc) = *(undefined4 *)((long)(pvVar18 + -1) + 4)
              ;
              *(undefined4 *)((long)(pvVar18 + 1) + 0x10) = uVar12;
              *(undefined4 *)((long)(pvVar18 + 1) + 0x14) = uVar13;
              *(HighsInt *)(pvVar18 + 2) = HVar14;
              *(undefined4 *)(pvVar18 + 1) = uVar8;
              *(undefined4 *)((long)(pvVar18 + 1) + 4) = uVar9;
              *(undefined4 *)((long)(pvVar18 + 1) + 8) = uVar10;
              *(undefined4 *)((long)(pvVar18 + 1) + 0xc) = uVar11;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)((long)(pvVar18 + 2) + 8),pvVar18);
              if (lVar32 == 0) break;
              lVar32 = lVar32 + 0x38;
              pvVar16 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        ((long)(pvVar18 + -3) + 0x10);
            } while (*(double *)(pvVar18 + -3) <= (double)local_b8 &&
                     (double)local_b8 != *(double *)(pvVar18 + -3));
            *(double *)((long)(pvVar18 + -2) + 0x10) = local_e8;
            *(ulong *)(pvVar18 + -1) = CONCAT44(uStack_dc,uStack_e0);
            *(pointer *)((long)(pvVar18 + -1) + 8) = local_b8;
            *(HighsInt *)((long)(pvVar18 + -1) + 0x10) = HVar4;
            ppVar5 = (pvVar18->
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            (pvVar18->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = ppVar25;
            (pvVar18->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppVar29;
            (pvVar18->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
            end._M_current = local_88;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
              end._M_current = local_88;
            }
          }
          pvVar27 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    ((long)(pvVar27 + 2) + 8);
          lVar17 = lVar17 + -0x38;
          pFVar31 = pFVar19 + 1;
          _Var23._M_current = pFVar19;
        } while (pFVar19 + 1 != end._M_current);
LAB_002f2529:
        bVar15 = true;
      }
    }
    else {
      uVar28 = (lVar17 >> 3) * 0x6db6db6db6db6db7;
      uVar24 = uVar28 >> 1;
      pFVar31 = begin._M_current + uVar24;
      if (lVar17 < 0x1c01) {
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                  (pFVar31,begin._M_current,local_78);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                  (begin._M_current,pFVar31,local_78);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                  (begin._M_current + 1,begin._M_current + (uVar24 - 1),local_50);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                  (begin._M_current + 2,begin._M_current + uVar24 + 1,local_58);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                  (begin._M_current + (uVar24 - 1),pFVar31,begin._M_current + uVar24 + 1);
        local_e8 = (begin._M_current)->fractionality;
        uStack_d4 = *(undefined8 *)((long)&(begin._M_current)->score + 4);
        uStack_d8 = (undefined4)
                    ((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20);
        uStack_e0 = SUB84((begin._M_current)->row_ep_norm2,0);
        uStack_dc = (undefined4)((ulong)(begin._M_current)->row_ep_norm2 >> 0x20);
        ppVar25 = ((begin._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b8 = ((begin._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppStack_b0 = ((begin._M_current)->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        ((begin._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        ((begin._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        ((begin._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar8 = *(undefined4 *)((long)&pFVar31->fractionality + 4);
        uVar9 = *(undefined4 *)&pFVar31->row_ep_norm2;
        uVar10 = *(undefined4 *)((long)&pFVar31->row_ep_norm2 + 4);
        uVar11 = *(undefined4 *)((long)&pFVar31->row_ep_norm2 + 4);
        uVar12 = *(undefined4 *)&pFVar31->score;
        uVar13 = *(undefined4 *)((long)&pFVar31->score + 4);
        HVar4 = pFVar31->basisIndex;
        *(undefined4 *)&(begin._M_current)->fractionality = *(undefined4 *)&pFVar31->fractionality;
        *(undefined4 *)((long)&(begin._M_current)->fractionality + 4) = uVar8;
        *(undefined4 *)&(begin._M_current)->row_ep_norm2 = uVar9;
        *(undefined4 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar10;
        *(undefined4 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar11;
        *(undefined4 *)&(begin._M_current)->score = uVar12;
        *(undefined4 *)((long)&(begin._M_current)->score + 4) = uVar13;
        (begin._M_current)->basisIndex = HVar4;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(&(begin._M_current)->row_ep,&pFVar31->row_ep);
        *(ulong *)((long)&pFVar31->row_ep_norm2 + 4) = CONCAT44(uStack_d8,uStack_dc);
        *(undefined8 *)((long)&pFVar31->score + 4) = uStack_d4;
        pFVar31->fractionality = local_e8;
        pFVar31->row_ep_norm2 = (double)CONCAT44(uStack_dc,uStack_e0);
        ppVar29 = (pFVar31->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = local_b8;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppStack_b0;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar25;
        if (ppVar29 != (pointer)0x0) {
          operator_delete(ppVar29);
        }
      }
      if (((param_4 & 1) != 0) ||
         ((begin._M_current)->score <= begin._M_current[-1].score &&
          begin._M_current[-1].score != (begin._M_current)->score)) {
        pVar33 = partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                           (begin._M_current,end._M_current);
        _Var20 = pVar33.first._M_current;
        lVar17 = (long)_Var20._M_current - (long)begin._M_current;
        uVar24 = (lVar17 >> 3) * 0x6db6db6db6db6db7;
        pFVar31 = _Var20._M_current + 1;
        ppVar29 = (pointer)((long)end._M_current - (long)pFVar31);
        ppVar25 = (pointer)(((long)ppVar29 >> 3) * 0x6db6db6db6db6db7);
        uVar28 = uVar28 >> 3;
        _Var23._M_current = _Var20._M_current;
        if (((long)uVar24 < (long)uVar28) || ((long)ppVar25 < (long)uVar28)) {
          local_9c = local_9c + -1;
          if (local_9c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<FractionalInteger>>>
                      (begin,end,(_Iter_comp_iter<std::less<FractionalInteger>_> *)&local_e8);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<FractionalInteger>>>
                      (begin,end,(_Iter_comp_iter<std::less<FractionalInteger>_> *)&local_e8);
            local_9c = 0;
LAB_002f316a:
            bVar15 = true;
            goto LAB_002f316f;
          }
          if (0x508 < lVar17) {
            local_c8 = (pointer)(uVar24 >> 2);
            local_70 = (long)local_c8 * 0x38;
            local_e8 = (begin._M_current)->fractionality;
            uStack_d4 = *(undefined8 *)((long)&(begin._M_current)->score + 4);
            uStack_d8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20
                        );
            uStack_e0 = SUB84((begin._M_current)->row_ep_norm2,0);
            uStack_dc = (undefined4)((ulong)(begin._M_current)->row_ep_norm2 >> 0x20);
            ppVar5 = ((begin._M_current)->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar27 = &begin._M_current[(long)local_c8].row_ep;
            local_98 = ((begin._M_current)->row_ep).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_90 = ((begin._M_current)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar8 = *(undefined4 *)((long)(pvVar27 + -2) + 0x14);
            uVar9 = *(undefined4 *)(pvVar27 + -1);
            uVar10 = *(undefined4 *)((long)(pvVar27 + -1) + 4);
            uVar11 = *(undefined4 *)((long)(pvVar27 + -1) + 4);
            uVar12 = *(undefined4 *)((long)(pvVar27 + -1) + 8);
            uVar13 = *(undefined4 *)((long)(pvVar27 + -1) + 0xc);
            HVar4 = *(HighsInt *)((long)(pvVar27 + -1) + 0x10);
            *(undefined4 *)&(begin._M_current)->fractionality =
                 *(undefined4 *)((long)(pvVar27 + -2) + 0x10);
            *(undefined4 *)((long)&(begin._M_current)->fractionality + 4) = uVar8;
            *(undefined4 *)&(begin._M_current)->row_ep_norm2 = uVar9;
            *(undefined4 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar10;
            *(undefined4 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar11;
            *(undefined4 *)&(begin._M_current)->score = uVar12;
            *(undefined4 *)((long)&(begin._M_current)->score + 4) = uVar13;
            (begin._M_current)->basisIndex = HVar4;
            local_b8 = ppVar25;
            local_68 = ppVar29;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&(begin._M_current)->row_ep,pvVar27);
            *(ulong *)((long)(pvVar27 + -1) + 4) = CONCAT44(uStack_d8,uStack_dc);
            *(undefined8 *)((long)(pvVar27 + -1) + 0xc) = uStack_d4;
            *(double *)((long)(pvVar27 + -2) + 0x10) = local_e8;
            *(ulong *)(pvVar27 + -1) = CONCAT44(uStack_dc,uStack_e0);
            ppVar25 = (pvVar27->
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_98;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_90;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
            if (ppVar25 != (pointer)0x0) {
              operator_delete(ppVar25);
            }
            ppVar5 = local_c8;
            local_e8 = _Var20._M_current[-1].fractionality;
            uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[-1].score + 4);
            uStack_d8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&_Var20._M_current[-1].row_ep_norm2 + 4) >>
                        0x20);
            uStack_e0 = SUB84(_Var20._M_current[-1].row_ep_norm2,0);
            uStack_dc = (undefined4)((ulong)_Var20._M_current[-1].row_ep_norm2 >> 0x20);
            ppVar25 = _Var20._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98 = _Var20._M_current[-1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_90 = _Var20._M_current[-1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            _Var20._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var20._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var20._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pFVar19 = _Var20._M_current + -(long)local_c8;
            uVar8 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
            uVar9 = *(undefined4 *)&pFVar19->row_ep_norm2;
            uVar10 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
            puVar1 = (undefined4 *)((long)&_Var20._M_current[-(long)local_c8].row_ep_norm2 + 4);
            uVar11 = *puVar1;
            uVar12 = puVar1[1];
            uVar13 = puVar1[2];
            HVar4 = puVar1[3];
            *(undefined4 *)&_Var20._M_current[-1].fractionality =
                 *(undefined4 *)&pFVar19->fractionality;
            *(undefined4 *)((long)&_Var20._M_current[-1].fractionality + 4) = uVar8;
            *(undefined4 *)&_Var20._M_current[-1].row_ep_norm2 = uVar9;
            *(undefined4 *)((long)&_Var20._M_current[-1].row_ep_norm2 + 4) = uVar10;
            *(undefined4 *)((long)&_Var20._M_current[-1].row_ep_norm2 + 4) = uVar11;
            *(undefined4 *)&_Var20._M_current[-1].score = uVar12;
            *(undefined4 *)((long)&_Var20._M_current[-1].score + 4) = uVar13;
            _Var20._M_current[-1].basisIndex = HVar4;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&_Var20._M_current[-1].row_ep,&_Var20._M_current[-(long)local_c8].row_ep)
            ;
            puVar3 = (undefined8 *)((long)&_Var20._M_current[-(long)ppVar5].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(uStack_d8,uStack_dc);
            puVar3[1] = uStack_d4;
            _Var20._M_current[-(long)ppVar5].fractionality = local_e8;
            _Var20._M_current[-(long)ppVar5].row_ep_norm2 = (double)CONCAT44(uStack_dc,uStack_e0);
            ppVar29 = _Var20._M_current[-(long)ppVar5].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            _Var20._M_current[-(long)ppVar5].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = local_98;
            _Var20._M_current[-(long)ppVar5].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppStack_90;
            _Var20._M_current[-(long)ppVar5].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar25;
            if (ppVar29 != (pointer)0x0) {
              operator_delete(ppVar29);
            }
            lVar32 = local_70;
            ppVar25 = local_b8;
            ppVar29 = local_68;
            if (0x1c00 < lVar17) {
              local_e8 = begin._M_current[1].fractionality;
              uStack_d4 = *(undefined8 *)((long)&begin._M_current[1].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&begin._M_current[1].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(begin._M_current[1].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)begin._M_current[1].row_ep_norm2 >> 0x20);
              ppVar25 = begin._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)
                       ((long)&begin._M_current[1].row_ep.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_70);
              local_98 = begin._M_current[1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_90 = begin._M_current[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar8 = *(undefined4 *)((long)puVar3 + -0x1c);
              uVar9 = *(undefined4 *)(puVar3 + -3);
              uVar10 = *(undefined4 *)((long)puVar3 + -0x14);
              uVar11 = *(undefined4 *)((long)puVar3 + -0x14);
              uVar12 = *(undefined4 *)(puVar3 + -2);
              uVar13 = *(undefined4 *)((long)puVar3 + -0xc);
              HVar4 = *(HighsInt *)(puVar3 + -1);
              *(undefined4 *)&begin._M_current[1].fractionality = *(undefined4 *)(puVar3 + -4);
              *(undefined4 *)((long)&begin._M_current[1].fractionality + 4) = uVar8;
              *(undefined4 *)&begin._M_current[1].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&begin._M_current[1].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&begin._M_current[1].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&begin._M_current[1].score = uVar12;
              *(undefined4 *)((long)&begin._M_current[1].score + 4) = uVar13;
              begin._M_current[1].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&begin._M_current[1].row_ep,puVar3);
              *(ulong *)((long)puVar3 + -0x14) = CONCAT44(uStack_d8,uStack_dc);
              *(undefined8 *)((long)puVar3 + -0xc) = uStack_d4;
              puVar3[-4] = local_e8;
              puVar3[-3] = CONCAT44(uStack_dc,uStack_e0);
              pvVar6 = (void *)*puVar3;
              *puVar3 = local_98;
              puVar3[1] = ppStack_90;
              puVar3[2] = ppVar25;
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6);
              }
              local_e8 = begin._M_current[2].fractionality;
              uStack_d4 = *(undefined8 *)((long)&begin._M_current[2].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&begin._M_current[2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(begin._M_current[2].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)begin._M_current[2].row_ep_norm2 >> 0x20);
              ppVar25 = begin._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar3 = (undefined8 *)
                       ((long)&begin._M_current[2].row_ep.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar32);
              local_98 = begin._M_current[2].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_90 = begin._M_current[2].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar8 = *(undefined4 *)((long)puVar3 + -0x1c);
              uVar9 = *(undefined4 *)(puVar3 + -3);
              uVar10 = *(undefined4 *)((long)puVar3 + -0x14);
              uVar11 = *(undefined4 *)((long)puVar3 + -0x14);
              uVar12 = *(undefined4 *)(puVar3 + -2);
              uVar13 = *(undefined4 *)((long)puVar3 + -0xc);
              HVar4 = *(HighsInt *)(puVar3 + -1);
              *(undefined4 *)&begin._M_current[2].fractionality = *(undefined4 *)(puVar3 + -4);
              *(undefined4 *)((long)&begin._M_current[2].fractionality + 4) = uVar8;
              *(undefined4 *)&begin._M_current[2].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&begin._M_current[2].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&begin._M_current[2].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&begin._M_current[2].score = uVar12;
              *(undefined4 *)((long)&begin._M_current[2].score + 4) = uVar13;
              begin._M_current[2].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&begin._M_current[2].row_ep,puVar3);
              *(ulong *)((long)puVar3 + -0x14) = CONCAT44(uStack_d8,uStack_dc);
              *(undefined8 *)((long)puVar3 + -0xc) = uStack_d4;
              puVar3[-4] = local_e8;
              puVar3[-3] = CONCAT44(uStack_dc,uStack_e0);
              pvVar6 = (void *)*puVar3;
              *puVar3 = local_98;
              puVar3[1] = ppStack_90;
              puVar3[2] = ppVar25;
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6);
              }
              uVar24 = ~(ulong)local_c8;
              local_e8 = _Var20._M_current[-2].fractionality;
              uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[-2].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var20._M_current[-2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(_Var20._M_current[-2].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)_Var20._M_current[-2].row_ep_norm2 >> 0x20);
              ppVar25 = _Var20._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_98 = _Var20._M_current[-2].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_90 = _Var20._M_current[-2].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              _Var20._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var20._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var20._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19 = _Var20._M_current + uVar24;
              uVar8 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
              uVar9 = *(undefined4 *)&pFVar19->row_ep_norm2;
              uVar10 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
              puVar1 = (undefined4 *)((long)&_Var20._M_current[uVar24].row_ep_norm2 + 4);
              uVar11 = *puVar1;
              uVar12 = puVar1[1];
              uVar13 = puVar1[2];
              HVar4 = puVar1[3];
              *(undefined4 *)&_Var20._M_current[-2].fractionality =
                   *(undefined4 *)&pFVar19->fractionality;
              *(undefined4 *)((long)&_Var20._M_current[-2].fractionality + 4) = uVar8;
              *(undefined4 *)&_Var20._M_current[-2].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&_Var20._M_current[-2].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&_Var20._M_current[-2].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&_Var20._M_current[-2].score = uVar12;
              *(undefined4 *)((long)&_Var20._M_current[-2].score + 4) = uVar13;
              _Var20._M_current[-2].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&_Var20._M_current[-2].row_ep,&_Var20._M_current[uVar24].row_ep);
              puVar3 = (undefined8 *)((long)&_Var20._M_current[uVar24].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(uStack_d8,uStack_dc);
              puVar3[1] = uStack_d4;
              _Var20._M_current[uVar24].fractionality = local_e8;
              _Var20._M_current[uVar24].row_ep_norm2 = (double)CONCAT44(uStack_dc,uStack_e0);
              ppVar29 = _Var20._M_current[uVar24].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              _Var20._M_current[uVar24].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_98;
              _Var20._M_current[uVar24].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppStack_90;
              _Var20._M_current[uVar24].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar25;
              if (ppVar29 != (pointer)0x0) {
                operator_delete(ppVar29);
              }
              lVar17 = -2 - (long)local_c8;
              local_e8 = _Var20._M_current[-3].fractionality;
              uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[-3].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var20._M_current[-3].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(_Var20._M_current[-3].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)_Var20._M_current[-3].row_ep_norm2 >> 0x20);
              ppVar25 = _Var20._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8 = _Var20._M_current[-3].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_c0 = _Var20._M_current[-3].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              _Var20._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var20._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var20._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19 = _Var20._M_current + lVar17;
              uVar8 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
              uVar9 = *(undefined4 *)&pFVar19->row_ep_norm2;
              uVar10 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
              puVar1 = (undefined4 *)((long)&_Var20._M_current[lVar17].row_ep_norm2 + 4);
              uVar11 = *puVar1;
              uVar12 = puVar1[1];
              uVar13 = puVar1[2];
              HVar4 = puVar1[3];
              *(undefined4 *)&_Var20._M_current[-3].fractionality =
                   *(undefined4 *)&pFVar19->fractionality;
              *(undefined4 *)((long)&_Var20._M_current[-3].fractionality + 4) = uVar8;
              *(undefined4 *)&_Var20._M_current[-3].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&_Var20._M_current[-3].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&_Var20._M_current[-3].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&_Var20._M_current[-3].score = uVar12;
              *(undefined4 *)((long)&_Var20._M_current[-3].score + 4) = uVar13;
              _Var20._M_current[-3].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&_Var20._M_current[-3].row_ep,&_Var20._M_current[lVar17].row_ep);
              puVar3 = (undefined8 *)((long)&_Var20._M_current[lVar17].row_ep_norm2 + 4);
              *puVar3 = CONCAT44(uStack_d8,uStack_dc);
              puVar3[1] = uStack_d4;
              _Var20._M_current[lVar17].fractionality = local_e8;
              _Var20._M_current[lVar17].row_ep_norm2 = (double)CONCAT44(uStack_dc,uStack_e0);
              ppVar5 = _Var20._M_current[lVar17].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              _Var20._M_current[lVar17].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_c8;
              _Var20._M_current[lVar17].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
              _Var20._M_current[lVar17].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar25;
              ppVar25 = local_b8;
              ppVar29 = local_68;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
                ppVar25 = local_b8;
                ppVar29 = local_68;
              }
            }
          }
          if (0x508 < (long)ppVar29) {
            ppVar25 = (pointer)((ulong)ppVar25 >> 2);
            local_e8 = pFVar31->fractionality;
            uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[1].score + 4);
            uStack_d8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&_Var20._M_current[1].row_ep_norm2 + 4) >>
                        0x20);
            uStack_e0 = SUB84(_Var20._M_current[1].row_ep_norm2,0);
            uStack_dc = (undefined4)((ulong)_Var20._M_current[1].row_ep_norm2 >> 0x20);
            ppVar5 = _Var20._M_current[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_c8 = _Var20._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_c0 = _Var20._M_current[1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            _Var20._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var20._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var20._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pFVar19 = _Var20._M_current + (long)((long)&ppVar25->first + 1);
            uVar8 = *(undefined4 *)&pFVar19->fractionality;
            uVar9 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
            uVar10 = *(undefined4 *)&pFVar19->row_ep_norm2;
            uVar11 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
            puVar1 = (undefined4 *)
                     ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep_norm2 + 4);
            uVar12 = puVar1[1];
            uVar13 = puVar1[2];
            HVar4 = puVar1[3];
            *(undefined4 *)((long)&_Var20._M_current[1].row_ep_norm2 + 4) = *puVar1;
            *(undefined4 *)&_Var20._M_current[1].score = uVar12;
            *(undefined4 *)((long)&_Var20._M_current[1].score + 4) = uVar13;
            _Var20._M_current[1].basisIndex = HVar4;
            *(undefined4 *)&pFVar31->fractionality = uVar8;
            *(undefined4 *)((long)&_Var20._M_current[1].fractionality + 4) = uVar9;
            *(undefined4 *)&_Var20._M_current[1].row_ep_norm2 = uVar10;
            *(undefined4 *)((long)&_Var20._M_current[1].row_ep_norm2 + 4) = uVar11;
            local_b8 = ppVar25;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&_Var20._M_current[1].row_ep,
                           &_Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep);
            puVar3 = (undefined8 *)
                     ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep_norm2 + 4);
            *puVar3 = CONCAT44(uStack_d8,uStack_dc);
            puVar3[1] = uStack_d4;
            _Var20._M_current[(long)((long)&ppVar25->first + 1)].fractionality = local_e8;
            _Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep_norm2 =
                 (double)CONCAT44(uStack_dc,uStack_e0);
            ppVar7 = _Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = local_c8;
            _Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
            _Var20._M_current[(long)((long)&ppVar25->first + 1)].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
            if (ppVar7 != (pointer)0x0) {
              operator_delete(ppVar7);
            }
            local_e8 = local_78->fractionality;
            uStack_d4 = *(undefined8 *)((long)&local_78->score + 4);
            uStack_d8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&local_78->row_ep_norm2 + 4) >> 0x20);
            uStack_e0 = SUB84(local_78->row_ep_norm2,0);
            uStack_dc = (undefined4)((ulong)local_78->row_ep_norm2 >> 0x20);
            ppVar5 = end._M_current[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar27 = &end._M_current[-(long)local_b8].row_ep;
            local_c8 = end._M_current[-1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_c0 = end._M_current[-1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            (local_38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar8 = *(undefined4 *)((long)(pvVar27 + -2) + 0x10);
            uVar9 = *(undefined4 *)((long)(pvVar27 + -2) + 0x14);
            uVar10 = *(undefined4 *)(pvVar27 + -1);
            uVar11 = *(undefined4 *)((long)(pvVar27 + -1) + 4);
            uVar12 = *(undefined4 *)((long)(pvVar27 + -1) + 8);
            uVar13 = *(undefined4 *)((long)(pvVar27 + -1) + 0xc);
            HVar4 = *(HighsInt *)((long)(pvVar27 + -1) + 0x10);
            *(undefined4 *)((long)&local_78->row_ep_norm2 + 4) =
                 *(undefined4 *)((long)(pvVar27 + -1) + 4);
            *(undefined4 *)&local_78->score = uVar12;
            *(undefined4 *)((long)&local_78->score + 4) = uVar13;
            local_78->basisIndex = HVar4;
            *(undefined4 *)&local_78->fractionality = uVar8;
            *(undefined4 *)((long)&local_78->fractionality + 4) = uVar9;
            *(undefined4 *)&local_78->row_ep_norm2 = uVar10;
            *(undefined4 *)((long)&local_78->row_ep_norm2 + 4) = uVar11;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(local_38,pvVar27);
            *(ulong *)((long)(pvVar27 + -1) + 4) = CONCAT44(uStack_d8,uStack_dc);
            *(undefined8 *)((long)(pvVar27 + -1) + 0xc) = uStack_d4;
            *(double *)((long)(pvVar27 + -2) + 0x10) = local_e8;
            *(ulong *)(pvVar27 + -1) = CONCAT44(uStack_dc,uStack_e0);
            ppVar7 = (pvVar27->
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_c8;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
            (pvVar27->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
            if (ppVar7 != (pointer)0x0) {
              operator_delete(ppVar7);
            }
            if (0x1c00 < (long)ppVar29) {
              local_e8 = _Var20._M_current[2].fractionality;
              uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[2].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var20._M_current[2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(_Var20._M_current[2].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)_Var20._M_current[2].row_ep_norm2 >> 0x20);
              ppVar29 = _Var20._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8 = _Var20._M_current[2].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_c0 = _Var20._M_current[2].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              _Var20._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var20._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var20._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19 = _Var20._M_current + (long)((long)&ppVar25->first + 2);
              uVar8 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
              uVar9 = *(undefined4 *)&pFVar19->row_ep_norm2;
              uVar10 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
              puVar1 = (undefined4 *)
                       ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep_norm2 + 4
                       );
              uVar11 = *puVar1;
              uVar12 = puVar1[1];
              uVar13 = puVar1[2];
              HVar4 = puVar1[3];
              *(undefined4 *)&_Var20._M_current[2].fractionality =
                   *(undefined4 *)&pFVar19->fractionality;
              *(undefined4 *)((long)&_Var20._M_current[2].fractionality + 4) = uVar8;
              *(undefined4 *)&_Var20._M_current[2].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&_Var20._M_current[2].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&_Var20._M_current[2].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&_Var20._M_current[2].score = uVar12;
              *(undefined4 *)((long)&_Var20._M_current[2].score + 4) = uVar13;
              _Var20._M_current[2].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&_Var20._M_current[2].row_ep,
                             (long)&_Var20._M_current[2].row_ep + (long)ppVar25 * 0x38);
              puVar3 = (undefined8 *)
                       ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep_norm2 + 4
                       );
              *puVar3 = CONCAT44(uStack_d8,uStack_dc);
              puVar3[1] = uStack_d4;
              _Var20._M_current[(long)((long)&ppVar25->first + 2)].fractionality = local_e8;
              _Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep_norm2 =
                   (double)CONCAT44(uStack_dc,uStack_e0);
              ppVar5 = _Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              _Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_c8;
              _Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
              _Var20._M_current[(long)((long)&ppVar25->first + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
              }
              local_e8 = _Var20._M_current[3].fractionality;
              uStack_d4 = *(undefined8 *)((long)&_Var20._M_current[3].score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var20._M_current[3].row_ep_norm2 + 4) >>
                          0x20);
              uStack_e0 = SUB84(_Var20._M_current[3].row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)_Var20._M_current[3].row_ep_norm2 >> 0x20);
              ppVar29 = _Var20._M_current[3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8 = _Var20._M_current[3].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_c0 = _Var20._M_current[3].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              _Var20._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var20._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var20._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar19 = _Var20._M_current + (long)((long)&ppVar25->first + 3);
              uVar8 = *(undefined4 *)((long)&pFVar19->fractionality + 4);
              uVar9 = *(undefined4 *)&pFVar19->row_ep_norm2;
              uVar10 = *(undefined4 *)((long)&pFVar19->row_ep_norm2 + 4);
              puVar1 = (undefined4 *)
                       ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep_norm2 + 4
                       );
              uVar11 = *puVar1;
              uVar12 = puVar1[1];
              uVar13 = puVar1[2];
              HVar4 = puVar1[3];
              *(undefined4 *)&_Var20._M_current[3].fractionality =
                   *(undefined4 *)&pFVar19->fractionality;
              *(undefined4 *)((long)&_Var20._M_current[3].fractionality + 4) = uVar8;
              *(undefined4 *)&_Var20._M_current[3].row_ep_norm2 = uVar9;
              *(undefined4 *)((long)&_Var20._M_current[3].row_ep_norm2 + 4) = uVar10;
              *(undefined4 *)((long)&_Var20._M_current[3].row_ep_norm2 + 4) = uVar11;
              *(undefined4 *)&_Var20._M_current[3].score = uVar12;
              *(undefined4 *)((long)&_Var20._M_current[3].score + 4) = uVar13;
              _Var20._M_current[3].basisIndex = HVar4;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&_Var20._M_current[3].row_ep,
                             (long)&_Var20._M_current[3].row_ep + (long)ppVar25 * 0x38);
              puVar3 = (undefined8 *)
                       ((long)&_Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep_norm2 + 4
                       );
              *puVar3 = CONCAT44(uStack_d8,uStack_dc);
              puVar3[1] = uStack_d4;
              _Var20._M_current[(long)((long)&ppVar25->first + 3)].fractionality = local_e8;
              _Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep_norm2 =
                   (double)CONCAT44(uStack_dc,uStack_e0);
              ppVar5 = _Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              _Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = local_c8;
              _Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
              _Var20._M_current[(long)((long)&ppVar25->first + 3)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
              }
              local_e8 = local_50->fractionality;
              uStack_d4 = *(undefined8 *)((long)&local_50->score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_50->row_ep_norm2 + 4) >> 0x20);
              uStack_e0 = SUB84(local_50->row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)local_50->row_ep_norm2 >> 0x20);
              ppVar25 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar27 = &end._M_current[~(ulong)local_b8].row_ep;
              local_c8 = end._M_current[-2].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_c0 = end._M_current[-2].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              (local_40->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_40->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_40->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar8 = *(undefined4 *)((long)(pvVar27 + -2) + 0x10);
              uVar9 = *(undefined4 *)((long)(pvVar27 + -2) + 0x14);
              uVar10 = *(undefined4 *)(pvVar27 + -1);
              uVar11 = *(undefined4 *)((long)(pvVar27 + -1) + 4);
              uVar12 = *(undefined4 *)((long)(pvVar27 + -1) + 8);
              uVar13 = *(undefined4 *)((long)(pvVar27 + -1) + 0xc);
              HVar4 = *(HighsInt *)((long)(pvVar27 + -1) + 0x10);
              *(undefined4 *)((long)&local_50->row_ep_norm2 + 4) =
                   *(undefined4 *)((long)(pvVar27 + -1) + 4);
              *(undefined4 *)&local_50->score = uVar12;
              *(undefined4 *)((long)&local_50->score + 4) = uVar13;
              local_50->basisIndex = HVar4;
              *(undefined4 *)&local_50->fractionality = uVar8;
              *(undefined4 *)((long)&local_50->fractionality + 4) = uVar9;
              *(undefined4 *)&local_50->row_ep_norm2 = uVar10;
              *(undefined4 *)((long)&local_50->row_ep_norm2 + 4) = uVar11;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(local_40,pvVar27);
              *(ulong *)((long)(pvVar27 + -1) + 4) = CONCAT44(uStack_d8,uStack_dc);
              *(undefined8 *)((long)(pvVar27 + -1) + 0xc) = uStack_d4;
              *(double *)((long)(pvVar27 + -2) + 0x10) = local_e8;
              *(ulong *)(pvVar27 + -1) = CONCAT44(uStack_dc,uStack_e0);
              ppVar29 = (pvVar27->
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = local_c8;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar25;
              if (ppVar29 != (pointer)0x0) {
                operator_delete(ppVar29);
              }
              local_e8 = local_58->fractionality;
              uStack_d4 = *(undefined8 *)((long)&local_58->score + 4);
              uStack_d8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_58->row_ep_norm2 + 4) >> 0x20);
              uStack_e0 = SUB84(local_58->row_ep_norm2,0);
              uStack_dc = (undefined4)((ulong)local_58->row_ep_norm2 >> 0x20);
              ppVar25 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar27 = &end._M_current[-2 - (long)local_b8].row_ep;
              local_b8 = end._M_current[-3].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_b0 = end._M_current[-3].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar8 = *(undefined4 *)((long)(pvVar27 + -2) + 0x10);
              uVar9 = *(undefined4 *)((long)(pvVar27 + -2) + 0x14);
              uVar10 = *(undefined4 *)(pvVar27 + -1);
              uVar11 = *(undefined4 *)((long)(pvVar27 + -1) + 4);
              uVar12 = *(undefined4 *)((long)(pvVar27 + -1) + 8);
              uVar13 = *(undefined4 *)((long)(pvVar27 + -1) + 0xc);
              HVar4 = *(HighsInt *)((long)(pvVar27 + -1) + 0x10);
              *(undefined4 *)((long)&local_58->row_ep_norm2 + 4) =
                   *(undefined4 *)((long)(pvVar27 + -1) + 4);
              *(undefined4 *)&local_58->score = uVar12;
              *(undefined4 *)((long)&local_58->score + 4) = uVar13;
              local_58->basisIndex = HVar4;
              *(undefined4 *)&local_58->fractionality = uVar8;
              *(undefined4 *)((long)&local_58->fractionality + 4) = uVar9;
              *(undefined4 *)&local_58->row_ep_norm2 = uVar10;
              *(undefined4 *)((long)&local_58->row_ep_norm2 + 4) = uVar11;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(local_48,pvVar27);
              *(ulong *)((long)(pvVar27 + -1) + 4) = CONCAT44(uStack_d8,uStack_dc);
              *(undefined8 *)((long)(pvVar27 + -1) + 0xc) = uStack_d4;
              *(double *)((long)(pvVar27 + -2) + 0x10) = local_e8;
              *(ulong *)(pvVar27 + -1) = CONCAT44(uStack_dc,uStack_e0);
              ppVar29 = (pvVar27->
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = local_b8;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = ppStack_b0;
              (pvVar27->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar25;
              if (ppVar29 != (pointer)0x0) {
                operator_delete(ppVar29);
              }
            }
          }
        }
        else if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_80 = pFVar31;
          if (begin._M_current == _Var20._M_current) {
LAB_002f2f9e:
            _Var23 = pVar33.first._M_current;
            if (local_80 == end._M_current) goto LAB_002f316a;
            pvVar27 = &_Var23._M_current[1].row_ep;
            lVar17 = 0x38;
            lVar32 = 0;
            ppVar25 = (pointer)0x0;
            do {
              pFVar31 = (FractionalInteger *)((long)&_Var23._M_current[1].fractionality + lVar17);
              if (pFVar31 == end._M_current) goto LAB_002f2529;
              local_b8 = *(pointer *)((long)&_Var23._M_current[1].score + lVar17);
              pdVar2 = (double *)((long)&(_Var23._M_current)->score + lVar17);
              if (*pdVar2 <= (double)local_b8 && (double)local_b8 != *pdVar2) {
                local_e8 = pFVar31->fractionality;
                uVar26 = *(undefined8 *)((long)&_Var23._M_current[1].row_ep_norm2 + lVar17);
                uStack_e0 = (undefined4)uVar26;
                uStack_dc = (undefined4)((ulong)uVar26 >> 0x20);
                local_70 = CONCAT44(local_70._4_4_,
                                    *(undefined4 *)((long)&_Var23._M_current[1].basisIndex + lVar17)
                                   );
                local_68 = *(pointer *)
                            ((long)&_Var23._M_current[1].row_ep.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17);
                ppStack_60 = *(pointer *)
                              ((long)&_Var23._M_current[1].row_ep.
                                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar17);
                local_98 = *(pointer *)
                            ((long)&_Var23._M_current[1].row_ep.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar17);
                *(undefined8 *)
                 ((long)&_Var23._M_current[1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar17) = 0;
                *(undefined8 *)
                 ((long)&_Var23._M_current[1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar17) = 0;
                *(undefined8 *)
                 ((long)&_Var23._M_current[1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar17) = 0;
                lVar21 = 0x38;
                pvVar16 = pvVar27;
                local_c8 = ppVar25;
                do {
                  pvVar18 = pvVar16;
                  lVar22 = lVar21;
                  uVar8 = *(undefined4 *)((long)(pvVar18 + -2) + 0x10);
                  uVar9 = *(undefined4 *)((long)(pvVar18 + -2) + 0x14);
                  uVar10 = *(undefined4 *)(pvVar18 + -1);
                  uVar11 = *(undefined4 *)((long)(pvVar18 + -1) + 4);
                  uVar12 = *(undefined4 *)((long)(pvVar18 + -1) + 8);
                  uVar13 = *(undefined4 *)((long)(pvVar18 + -1) + 0xc);
                  HVar4 = *(HighsInt *)((long)(pvVar18 + -1) + 0x10);
                  *(undefined4 *)((long)(pvVar18 + 1) + 0xc) =
                       *(undefined4 *)((long)(pvVar18 + -1) + 4);
                  *(undefined4 *)((long)(pvVar18 + 1) + 0x10) = uVar12;
                  *(undefined4 *)((long)(pvVar18 + 1) + 0x14) = uVar13;
                  *(HighsInt *)(pvVar18 + 2) = HVar4;
                  *(undefined4 *)(pvVar18 + 1) = uVar8;
                  *(undefined4 *)((long)(pvVar18 + 1) + 4) = uVar9;
                  *(undefined4 *)((long)(pvVar18 + 1) + 8) = uVar10;
                  *(undefined4 *)((long)(pvVar18 + 1) + 0xc) = uVar11;
                  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  *)((long)(pvVar18 + 2) + 8),pvVar18);
                  if (lVar22 + lVar32 == 0x38) break;
                  lVar21 = lVar22 + 0x38;
                  pvVar16 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)((long)(pvVar18 + -3) + 0x10);
                } while (*(double *)(pvVar18 + -3) <= (double)local_b8 &&
                         (double)local_b8 != *(double *)(pvVar18 + -3));
                *(double *)((long)(pvVar18 + -2) + 0x10) = local_e8;
                *(ulong *)(pvVar18 + -1) = CONCAT44(uStack_dc,uStack_e0);
                *(pointer *)((long)(pvVar18 + -1) + 8) = local_b8;
                *(HighsInt *)((long)(pvVar18 + -1) + 0x10) = (HighsInt)local_70;
                ppVar25 = (pvVar18->
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                (pvVar18->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start = local_68;
                (pvVar18->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = ppStack_60;
                (pvVar18->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
                if (ppVar25 != (pointer)0x0) {
                  operator_delete(ppVar25);
                }
                ppVar25 = (pointer)((long)local_c8 + (lVar22 >> 3) * 0x6db6db6db6db6db7);
                _Var23._M_current = _Var20._M_current;
                end._M_current = local_88;
              }
              lVar17 = lVar17 + 0x38;
              pvVar27 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        ((long)(pvVar27 + 2) + 8);
              lVar32 = lVar32 + -0x38;
              pFVar31 = local_80;
            } while (ppVar25 < (pointer)0x9);
          }
          else {
            lVar17 = 0;
            uVar24 = 0;
            _Var30._M_current = begin._M_current;
            do {
              pFVar31 = _Var30._M_current + 1;
              if (pFVar31 == pVar33.first._M_current._M_current) goto LAB_002f2f9e;
              local_b8 = (pointer)_Var30._M_current[1].score;
              if ((_Var30._M_current)->score <= (double)local_b8 &&
                  (double)local_b8 != (_Var30._M_current)->score) {
                local_e8 = pFVar31->fractionality;
                uStack_e0 = SUB84(_Var30._M_current[1].row_ep_norm2,0);
                uStack_dc = (undefined4)((ulong)_Var30._M_current[1].row_ep_norm2 >> 0x20);
                HVar4 = _Var30._M_current[1].basisIndex;
                local_c8 = _Var30._M_current[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppStack_c0 = _Var30._M_current[1].row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                local_68 = _Var30._M_current[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                _Var30._M_current[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                _Var30._M_current[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                _Var30._M_current[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar32 = 0;
                do {
                  lVar21 = lVar32;
                  puVar1 = (undefined4 *)((long)&(_Var30._M_current)->fractionality + lVar21);
                  puVar1[0x11] = puVar1[3];
                  puVar1[0x12] = puVar1[4];
                  puVar1[0x13] = puVar1[5];
                  puVar1[0x14] = puVar1[6];
                  puVar1[0xe] = *puVar1;
                  puVar1[0xf] = puVar1[1];
                  puVar1[0x10] = puVar1[2];
                  puVar1[0x11] = puVar1[3];
                  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  *)(puVar1 + 0x16),
                                 (long)&((_Var30._M_current)->row_ep).
                                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar21);
                  if (lVar17 == lVar21) break;
                  pdVar2 = (double *)((long)_Var30._M_current + lVar21 + -0x28);
                  lVar32 = lVar21 + -0x38;
                } while (*pdVar2 <= (double)local_b8 && (double)local_b8 != *pdVar2);
                pdVar2 = (double *)((long)&(_Var30._M_current)->fractionality + lVar21);
                *pdVar2 = local_e8;
                pdVar2[1] = (double)CONCAT44(uStack_dc,uStack_e0);
                *(pointer *)((long)&(_Var30._M_current)->score + lVar21) = local_b8;
                *(HighsInt *)((long)&(_Var30._M_current)->basisIndex + lVar21) = HVar4;
                pvVar6 = *(void **)((long)&((_Var30._M_current)->row_ep).
                                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar21);
                puVar3 = (undefined8 *)
                         ((long)&((_Var30._M_current)->row_ep).
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar21);
                *puVar3 = local_c8;
                puVar3[1] = ppStack_c0;
                *(pointer *)
                 ((long)&((_Var30._M_current)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar21) = local_68;
                uVar26 = extraout_RDX;
                if (pvVar6 != (void *)0x0) {
                  operator_delete(pvVar6);
                  uVar26 = extraout_RDX_00;
                }
                uVar24 = uVar24 + (0x38 - lVar21 >> 3) * 0x6db6db6db6db6db7;
                pVar33._8_8_ = uVar26;
                pVar33.first._M_current = _Var20._M_current;
                end._M_current = local_88;
              }
              _Var23 = pVar33.first._M_current;
              lVar17 = lVar17 + -0x38;
              _Var30._M_current = pFVar31;
              pFVar31 = local_80;
            } while (uVar24 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>,true>
                  (begin._M_current,_Var23._M_current,local_9c,param_4 & 1);
        bVar15 = false;
        param_4 = 0;
        begin._M_current = pFVar31;
      }
      else {
        begin = partition_left<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        bVar15 = false;
      }
    }
LAB_002f316f:
    if (bVar15) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }